

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O0

bitwidth_t __thiscall slang::SVInt::getMinRepresentedBits(SVInt *this)

{
  bool bVar1;
  bitwidth_t bVar2;
  long in_RDI;
  SVInt *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  undefined4 local_4;
  
  if ((*(byte *)(in_RDI + 0xc) & 1) == 0) {
    local_4 = getActiveBits((SVInt *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  else {
    bVar1 = isNegative((SVInt *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (bVar1) {
      iVar3 = *(int *)(in_RDI + 8);
      bVar2 = countLeadingOnes(in_stack_ffffffffffffffd8);
      local_4 = (iVar3 - bVar2) + 1;
    }
    else {
      local_4 = getActiveBits((SVInt *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                             );
      local_4 = local_4 + 1;
    }
  }
  return local_4;
}

Assistant:

bitwidth_t getMinRepresentedBits() const {
        if (!signFlag)
            return getActiveBits();
        else if (isNegative())
            return bitWidth - countLeadingOnes() + 1;
        else
            return getActiveBits() + 1;
    }